

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::DefaultFieldComparator::CompareDoubleOrFloat<double>
          (DefaultFieldComparator *this,FieldDescriptor *field,double value_1,double value_2)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Tolerance *pTVar3;
  byte bVar4;
  _Base_ptr p_Var5;
  Tolerance *pTVar6;
  bool bVar7;
  
  if ((value_1 == value_2) && (!NAN(value_1) && !NAN(value_2))) {
    return true;
  }
  bVar7 = this->float_comparison_ != EXACT;
  bVar4 = (NAN(value_2) && NAN(value_1)) & this->treat_nan_as_equal_;
  if (!bVar7 || bVar4 != 0) {
    return (bool)(bVar7 | bVar4);
  }
  p_Var5 = (this->map_tolerance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->map_tolerance_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var5 + 1) >= field) {
        p_Var2 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(FieldDescriptor **)(p_Var5 + 1) < field];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var2 != p_Var1) {
      pTVar6 = (Tolerance *)0x0;
      if (*(FieldDescriptor **)(p_Var2 + 1) <= field) {
        pTVar6 = (Tolerance *)&p_Var2[1]._M_parent;
      }
      goto LAB_002fe094;
    }
  }
  pTVar6 = (Tolerance *)0x0;
LAB_002fe094:
  pTVar3 = (Tolerance *)0x0;
  if ((this->has_default_tolerance_ & 1U) != 0) {
    pTVar3 = &this->default_tolerance_;
  }
  if (pTVar6 != (Tolerance *)0x0) {
    pTVar3 = pTVar6;
  }
  if (pTVar3 == (Tolerance *)0x0) {
    return ABS(value_1 - value_2) < 7.105427357601002e-15;
  }
  bVar7 = MathUtil::WithinFractionOrMargin<double>
                    (value_1,value_2,(double)pTVar3->fraction,(double)pTVar3->margin);
  return bVar7;
}

Assistant:

bool DefaultFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                  T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = FindOrNull(map_tolerance_, &field);
    if (tolerance == NULL && has_default_tolerance_) {
      tolerance = &default_tolerance_;
    }
    if (tolerance == NULL) {
      return MathUtil::AlmostEquals(value_1, value_2);
    } else {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return MathUtil::WithinFractionOrMargin(
          value_1, value_2, static_cast<T>(tolerance->fraction),
          static_cast<T>(tolerance->margin));
    }
  }
}